

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peigstubs.c
# Opt level: O1

void pnga_diag_std(Integer g_a,Integer g_v,DoublePrecision *eval)

{
  pnga_error("ga_diag:peigs not interfaced",0);
  return;
}

Assistant:

void pnga_diag_std(Integer g_a, Integer g_v, DoublePrecision *eval) {
#if ENABLE_PEIGS
#   if ENABLE_F77
    gai_diag_std_(&g_a, &g_v, eval);
#   else
    pnga_error("ga_diag:peigs interfaced, need to configure --enable-f77",0L);
#   endif
#else
    pnga_error("ga_diag:peigs not interfaced",0L);
#endif
}